

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.h
# Opt level: O2

void dual_inner_prod(opus_val16 *x,opus_val16 *y01,opus_val16 *y02,int N,opus_val32 *xy1,
                    opus_val32 *xy2)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  fVar3 = 0.0;
  fVar4 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar3 = fVar3 + y01[uVar1] * x[uVar1];
    fVar4 = fVar4 + y02[uVar1] * x[uVar1];
  }
  *xy1 = (opus_val32)fVar3;
  *xy2 = (opus_val32)fVar4;
  return;
}

Assistant:

static OPUS_INLINE void dual_inner_prod(const opus_val16 *x, const opus_val16 *y01, const opus_val16 *y02,
                                        int N, opus_val32 *xy1, opus_val32 *xy2) {
    int i;
    opus_val32 xy01 = 0;
    opus_val32 xy02 = 0;
    for (i = 0; i < N; i++) {
        xy01 = MAC16_16(xy01, x[i], y01[i]);
        xy02 = MAC16_16(xy02, x[i], y02[i]);
    }
    *xy1 = xy01;
    *xy2 = xy02;
}